

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O3

void reset_raw(Hacl_Hash_Blake2b_Simd256_state_t *state,
              K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key)

{
  undefined1 auVar1 [16];
  uint8_t uVar2;
  uint8_t uVar3;
  ushort uVar4;
  undefined8 uVar5;
  Lib_IntVector_Intrinsics_vec256 *palVar6;
  uint8_t *__dest;
  uint *puVar7;
  uint8_t *puVar8;
  Lib_IntVector_Intrinsics_vec256 alVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint64_t tmp2;
  uint8_t *bj;
  ulong uVar18;
  Lib_IntVector_Intrinsics_vec256 *r0;
  Hacl_Hash_Blake2b_blake2_params *pHVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined2 local_4a;
  undefined6 uStack_48;
  
  pHVar19 = key.fst;
  uVar2 = (state->block_state).fst;
  uVar3 = (state->block_state).snd;
  uStack_48 = (undefined6)((ulong)(state->block_state).thd.fst >> 0x10);
  uVar5 = *(undefined8 *)&(state->block_state).field_0x2;
  local_4a = (undefined2)((ulong)uVar5 >> 0x30);
  palVar6 = (state->block_state).thd.snd;
  __dest = state->buf;
  uVar18 = (ulong)pHVar19->key_length;
  if (uVar18 != 0) {
    memset(__dest + uVar18,0,(ulong)(0x80 - pHVar19->key_length));
    memcpy(__dest,key.snd,uVar18);
  }
  uVar4._0_1_ = pHVar19->node_depth;
  uVar4._1_1_ = pHVar19->inner_length;
  puVar7 = (uint *)pHVar19->salt;
  puVar8 = pHVar19->personal;
  auVar1[0] = pHVar19->digest_length;
  auVar1[1] = pHVar19->key_length;
  auVar1[2] = pHVar19->fanout;
  auVar1[3] = pHVar19->depth;
  auVar1._4_4_ = pHVar19->leaf_length;
  auVar1._8_8_ = pHVar19->node_offset;
  auVar20 = DAT_001dd000._0_16_;
  palVar6[2] = _DAT_001dd000;
  *(undefined4 *)palVar6[3] = 0xade682d1;
  *(undefined4 *)((long)palVar6[3] + 4) = 0x510e527f;
  *(undefined4 *)(palVar6[3] + 1) = 0x2b3e6c1f;
  *(undefined4 *)((long)palVar6[3] + 0xc) = 0x9b05688c;
  *(undefined4 *)(palVar6[3] + 2) = 0xfb41bd6b;
  *(undefined4 *)((long)palVar6[3] + 0x14) = 0x1f83d9ab;
  *(undefined4 *)(palVar6[3] + 3) = 0x137e2179;
  *(undefined4 *)((long)palVar6[3] + 0x1c) = 0x5be0cd19;
  uVar10 = *puVar7;
  uVar11 = puVar7[1];
  uVar12 = puVar7[2];
  uVar13 = puVar7[3];
  uVar18 = (ulong)uVar4 ^ 0x3c6ef372fe94f82b;
  uVar14 = *(uint *)(puVar8 + 0x10);
  uVar15 = *(uint *)(puVar8 + 0x14);
  uVar16 = *(uint *)(puVar8 + 0x18);
  uVar17 = *(uint *)(puVar8 + 0x1c);
  auVar22._8_8_ = 0xa54ff53a5f1d36f1;
  auVar22._0_8_ = 0xa54ff53a5f1d36f1;
  auVar22._16_8_ = 0xa54ff53a5f1d36f1;
  auVar22._24_8_ = 0xa54ff53a5f1d36f1;
  auVar21._8_8_ = uVar18;
  auVar21._0_8_ = uVar18;
  auVar21._16_8_ = uVar18;
  auVar21._24_8_ = uVar18;
  auVar21 = vpblendd_avx2(ZEXT1632(auVar20 ^ auVar1),auVar21,0x30);
  alVar9 = (Lib_IntVector_Intrinsics_vec256)vpblendd_avx2(auVar21,auVar22,0xc0);
  *palVar6 = alVar9;
  *(uint *)palVar6[1] = uVar10 ^ 0xade682d1;
  *(uint *)((long)palVar6[1] + 4) = uVar11 ^ 0x510e527f;
  *(uint *)(palVar6[1] + 1) = uVar12 ^ 0x2b3e6c1f;
  *(uint *)((long)palVar6[1] + 0xc) = uVar13 ^ 0x9b05688c;
  *(uint *)(palVar6[1] + 2) = uVar14 ^ 0xfb41bd6b;
  *(uint *)((long)palVar6[1] + 0x14) = uVar15 ^ 0x1f83d9ab;
  *(uint *)(palVar6[1] + 3) = uVar16 ^ 0x137e2179;
  *(uint *)((long)palVar6[1] + 0x1c) = uVar17 ^ 0x5be0cd19;
  (state->block_state).fst = uVar2;
  (state->block_state).snd = uVar3;
  (state->block_state).thd.fst = (Lib_IntVector_Intrinsics_vec256 *)CONCAT62(uStack_48,local_4a);
  *(undefined8 *)&(state->block_state).field_0x2 = uVar5;
  (state->block_state).thd.snd = palVar6;
  state->buf = __dest;
  state->total_len = (ulong)(uVar2 != '\0') << 7;
  return;
}

Assistant:

static void
reset_raw(
  Hacl_Hash_Blake2s_Simd128_state_t *state,
  K____Hacl_Impl_Blake2_Core_blake2_params___uint8_t_ key
)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  uint8_t *buf = scrut.buf;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state = scrut.block_state;
  uint8_t nn0 = block_state.snd;
  uint8_t kk10 = block_state.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk10, .digest_length = nn0 };
  KRML_MAYBE_UNUSED_VAR(i);
  Hacl_Hash_Blake2b_blake2_params *p = key.fst;
  uint8_t kk1 = p->key_length;
  uint8_t nn = p->digest_length;
  Hacl_Hash_Blake2b_index i1 = { .key_length = kk1, .digest_length = nn };
  uint32_t kk2 = (uint32_t)i1.key_length;
  uint8_t *k_1 = key.snd;
  if (!(kk2 == 0U))
  {
    uint8_t *sub_b = buf + kk2;
    memset(sub_b, 0U, (64U - kk2) * sizeof (uint8_t));
    memcpy(buf, k_1, kk2 * sizeof (uint8_t));
  }
  Hacl_Hash_Blake2b_blake2_params pv = p[0U];
  init_with_params(block_state.thd.snd, pv);
  uint8_t kk11 = i.key_length;
  uint32_t ite;
  if (kk11 != 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = 0U;
  }
  Hacl_Hash_Blake2s_Simd128_state_t
  tmp = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)ite };
  state[0U] = tmp;
}